

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

double * __thiscall yy::mylanguage_parser::value_type::as<double>(value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O1/parser.hpp"
                  ,0x140,"const T &yy::mylanguage_parser::value_type::as() const [T = double]");
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == _typeinfo) {
    return (double *)this;
  }
  if ((*__s1 != '*') && (iVar1 = strcmp(__s1,_typeinfo), iVar1 == 0)) {
    return (double *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alekratz[P]flex-bison-skeleton/build_O1/parser.hpp"
                ,0x141,"const T &yy::mylanguage_parser::value_type::as() const [T = double]");
}

Assistant:

const T&
    as () const YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }